

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

int __thiscall google::protobuf::FileOptions::ByteSize(FileOptions *this)

{
  byte bVar1;
  string *psVar2;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  
  bVar1 = (byte)this->_has_bits_[0];
  if (bVar1 == 0) {
    iVar5 = 0;
  }
  else {
    iVar5 = 0;
    if ((bVar1 & 1) != 0) {
      psVar2 = this->java_package_;
      uVar7 = (uint)psVar2->_M_string_length;
      iVar5 = 2;
      if (0x7f < uVar7) {
        iVar5 = io::CodedOutputStream::VarintSize32Fallback(uVar7);
        iVar5 = iVar5 + 1;
      }
      iVar5 = iVar5 + (int)psVar2->_M_string_length;
    }
    if ((this->_has_bits_[0] & 2) != 0) {
      psVar2 = this->java_outer_classname_;
      uVar7 = (uint)psVar2->_M_string_length;
      iVar6 = 1;
      if (0x7f < uVar7) {
        iVar6 = io::CodedOutputStream::VarintSize32Fallback(uVar7);
      }
      iVar5 = iVar5 + iVar6 + (int)psVar2->_M_string_length + 1;
    }
    uVar7 = this->_has_bits_[0];
    uVar8 = uVar7 >> 1 & 2;
    uVar4 = uVar8 + 3;
    if ((uVar7 & 8) == 0) {
      uVar4 = uVar8;
    }
    iVar5 = uVar4 + iVar5;
    if ((uVar7 & 0x10) != 0) {
      uVar7 = this->optimize_for_;
      if ((int)uVar7 < 0) {
        iVar6 = 0xb;
      }
      else {
        iVar6 = 2;
        if (0x7f < uVar7) {
          iVar6 = io::CodedOutputStream::VarintSize32Fallback(uVar7);
          iVar6 = iVar6 + 1;
        }
      }
      iVar5 = iVar5 + iVar6;
    }
    if ((this->_has_bits_[0] & 0x20) != 0) {
      psVar2 = this->go_package_;
      uVar7 = (uint)psVar2->_M_string_length;
      iVar6 = 1;
      if (0x7f < uVar7) {
        iVar6 = io::CodedOutputStream::VarintSize32Fallback(uVar7);
      }
      iVar5 = iVar5 + iVar6 + (int)psVar2->_M_string_length + 1;
    }
    iVar6 = iVar5 + 3;
    if ((this->_has_bits_[0] & 0x40) == 0) {
      iVar6 = iVar5;
    }
    iVar5 = iVar6 + 3;
    if (-1 < (char)this->_has_bits_[0]) {
      iVar5 = iVar6;
    }
  }
  iVar6 = iVar5 + 3;
  if ((this->_has_bits_[0] & 0x100) == 0) {
    iVar6 = iVar5;
  }
  iVar5 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
  iVar6 = iVar6 + iVar5 * 2;
  if (0 < iVar5) {
    lVar9 = 0;
    do {
      uVar7 = UninterpretedOption::ByteSize
                        ((UninterpretedOption *)
                         (this->uninterpreted_option_).super_RepeatedPtrFieldBase.elements_[lVar9]);
      iVar5 = 1;
      if (0x7f < uVar7) {
        iVar5 = io::CodedOutputStream::VarintSize32Fallback(uVar7);
      }
      iVar6 = iVar6 + uVar7 + iVar5;
      lVar9 = lVar9 + 1;
    } while (lVar9 < (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_);
  }
  iVar5 = internal::ExtensionSet::ByteSize(&this->_extensions_);
  iVar5 = iVar5 + iVar6;
  pvVar3 = (this->_unknown_fields_).fields_;
  if ((pvVar3 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar3->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar3->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    iVar6 = internal::WireFormat::ComputeUnknownFieldsSize(&this->_unknown_fields_);
    iVar5 = iVar5 + iVar6;
  }
  this->_cached_size_ = iVar5;
  return iVar5;
}

Assistant:

int FileOptions::ByteSize() const {
  int total_size = 0;

  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    // optional string java_package = 1;
    if (has_java_package()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->java_package());
    }

    // optional string java_outer_classname = 8;
    if (has_java_outer_classname()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->java_outer_classname());
    }

    // optional bool java_multiple_files = 10 [default = false];
    if (has_java_multiple_files()) {
      total_size += 1 + 1;
    }

    // optional bool java_generate_equals_and_hash = 20 [default = false];
    if (has_java_generate_equals_and_hash()) {
      total_size += 2 + 1;
    }

    // optional .google.protobuf.FileOptions.OptimizeMode optimize_for = 9 [default = SPEED];
    if (has_optimize_for()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->optimize_for());
    }

    // optional string go_package = 11;
    if (has_go_package()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->go_package());
    }

    // optional bool cc_generic_services = 16 [default = false];
    if (has_cc_generic_services()) {
      total_size += 2 + 1;
    }

    // optional bool java_generic_services = 17 [default = false];
    if (has_java_generic_services()) {
      total_size += 2 + 1;
    }

  }
  if (_has_bits_[8 / 32] & (0xffu << (8 % 32))) {
    // optional bool py_generic_services = 18 [default = false];
    if (has_py_generic_services()) {
      total_size += 2 + 1;
    }

  }
  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  total_size += 2 * this->uninterpreted_option_size();
  for (int i = 0; i < this->uninterpreted_option_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->uninterpreted_option(i));
  }

  total_size += _extensions_.ByteSize();

  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}